

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_function_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindAggregate
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,FunctionExpression *expr,
          AggregateFunctionCatalogEntry *function,idx_t depth)

{
  string sStack_48;
  
  (*this->_vptr_ExpressionBinder[0xd])(&sStack_48);
  BindUnsupportedExpression
            (__return_storage_ptr__,this,&expr->super_ParsedExpression,depth,&sStack_48);
  ::std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindAggregate(FunctionExpression &expr, AggregateFunctionCatalogEntry &function,
                                           idx_t depth) {
	return BindUnsupportedExpression(expr, depth, UnsupportedAggregateMessage());
}